

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_mtx_alloc(nng_mtx **mpp)

{
  nng_mtx *mtx;
  nng_mtx *mp;
  nng_mtx **mpp_local;
  
  mtx = (nng_mtx *)nni_zalloc(0x28);
  if (mtx == (nng_mtx *)0x0) {
    mpp_local._4_4_ = 2;
  }
  else {
    nni_mtx_init((nni_mtx *)mtx);
    *mpp = mtx;
    mpp_local._4_4_ = 0;
  }
  return mpp_local._4_4_;
}

Assistant:

int
nng_mtx_alloc(nng_mtx **mpp)
{
	nng_mtx *mp;

	if ((mp = NNI_ALLOC_STRUCT(mp)) == NULL) {
		return (NNG_ENOMEM);
	}
	nni_mtx_init(&mp->m);
	*mpp = mp;
	return (0);
}